

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_DistributionMapping.cpp
# Opt level: O0

void __thiscall
amrex::DistributionMapping::KnapSackDoIt
          (DistributionMapping *this,vector<long,_std::allocator<long>_> *wgts,int param_3,
          Real *efficiency,bool do_full_knapsack,int nmax,bool sort)

{
  vector<long,_std::allocator<long>_> *this_00;
  bool bVar1;
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  reference piVar5;
  const_reference pvVar6;
  reference pvVar7;
  int *piVar8;
  Print *this_01;
  undefined8 *in_RCX;
  vector<long,_std::allocator<long>_> *in_RSI;
  byte in_R8B;
  byte in_stack_00000008;
  int j_1;
  int N;
  vector<int,_std::allocator<int>_> *vi;
  int tid;
  int idx;
  int i_2;
  Vector<int,_std::allocator<int>_> *v;
  iterator __end3;
  iterator __begin3;
  Vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
  *__range3;
  Vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
  wrkerord;
  Vector<int,_std::allocator<int>_> ord;
  pair<long,_int> *p;
  iterator __end2;
  iterator __begin2;
  vector<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_> *__range2;
  const_iterator End;
  const_iterator lit;
  Long wgt;
  int i_1;
  vector<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_> LIpairV;
  int nj;
  int j;
  int ni;
  int i;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  vec;
  int nworkers;
  int nteams;
  int nprocs;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffff428;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffff430;
  undefined8 in_stack_fffffffffffff438;
  ostream *in_stack_fffffffffffff440;
  size_type in_stack_fffffffffffff448;
  undefined4 in_stack_fffffffffffff450;
  undefined4 in_stack_fffffffffffff454;
  Print *in_stack_fffffffffffff458;
  Print *in_stack_fffffffffffff460;
  undefined8 in_stack_fffffffffffff468;
  Vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
  *in_stack_fffffffffffff470;
  Vector<int,_std::allocator<int>_> *in_stack_fffffffffffff478;
  DistributionMapping *in_stack_fffffffffffff480;
  Print *in_stack_fffffffffffff4a0;
  int local_934;
  int in_stack_fffffffffffff810;
  undefined1 in_stack_fffffffffffff817;
  Real *in_stack_fffffffffffff818;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *in_stack_fffffffffffff820;
  int in_stack_fffffffffffff82c;
  vector<long,_std::allocator<long>_> *in_stack_fffffffffffff830;
  int local_78c;
  __normal_iterator<amrex::Vector<int,_std::allocator<int>_>_*,_std::vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>_>
  local_768;
  undefined1 *local_760;
  int *local_758;
  int *local_750;
  int *local_748;
  int *local_740;
  undefined1 local_738 [440];
  reference local_580;
  pair<long,_int> *local_578;
  __normal_iterator<std::pair<long,_int>_*,_std::vector<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>_>
  local_570;
  vector<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_> *local_568;
  pair<long,_int> local_560;
  int *local_550;
  int *local_540;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_538;
  long local_530;
  int local_524;
  vector<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_> local_520 [17];
  int local_380;
  int local_37c;
  int local_1f0;
  int local_1ec;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_1e8;
  undefined4 local_1d0;
  int local_1cc;
  int local_1c8;
  byte local_29;
  byte local_21;
  undefined8 *local_20;
  vector<long,_std::allocator<long>_> *local_10;
  
  local_21 = in_R8B & 1;
  local_29 = in_stack_00000008 & 1;
  local_20 = in_RCX;
  local_10 = in_RSI;
  if (::(anonymous_namespace)::flag_verbose_mapper != 0) {
    OutStream();
    Print::Print(in_stack_fffffffffffff460,(ostream *)in_stack_fffffffffffff458);
    Print::operator<<((Print *)in_stack_fffffffffffff430._M_current,
                      (char (*) [27])in_stack_fffffffffffff428._M_current);
    Print::operator<<((Print *)in_stack_fffffffffffff430._M_current,
                      (_func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
                       *)in_stack_fffffffffffff428._M_current);
    Print::~Print(in_stack_fffffffffffff4a0);
  }
  local_1cc = ParallelContext::NProcsSub();
  local_1d0 = 1;
  local_1c8 = local_1cc;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)0xf55600);
  *local_20 = 0;
  knapsack(in_stack_fffffffffffff830,in_stack_fffffffffffff82c,in_stack_fffffffffffff820,
           in_stack_fffffffffffff818,(bool)in_stack_fffffffffffff817,in_stack_fffffffffffff810);
  if (::(anonymous_namespace)::flag_verbose_mapper != 0) {
    local_1ec = 0;
    sVar3 = std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::size(&local_1e8);
    local_1f0 = (int)sVar3;
    for (; local_1ec < local_1f0; local_1ec = local_1ec + 1) {
      OutStream();
      Print::Print(in_stack_fffffffffffff460,(ostream *)in_stack_fffffffffffff458);
      Print::operator<<((Print *)in_stack_fffffffffffff430._M_current,
                        (char (*) [10])in_stack_fffffffffffff428._M_current);
      Print::operator<<((Print *)in_stack_fffffffffffff430._M_current,
                        in_stack_fffffffffffff428._M_current);
      Print::operator<<((Print *)in_stack_fffffffffffff430._M_current,
                        (char (*) [17])in_stack_fffffffffffff428._M_current);
      Print::operator<<((Print *)in_stack_fffffffffffff430._M_current,
                        (_func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
                         *)in_stack_fffffffffffff428._M_current);
      Print::~Print(in_stack_fffffffffffff4a0);
      local_37c = 0;
      pvVar4 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](&local_1e8,(long)local_1ec);
      sVar3 = std::vector<int,_std::allocator<int>_>::size(pvVar4);
      local_380 = (int)sVar3;
      for (; local_37c < local_380; local_37c = local_37c + 1) {
        OutStream();
        Print::Print(in_stack_fffffffffffff460,(ostream *)in_stack_fffffffffffff458);
        Print::operator<<((Print *)in_stack_fffffffffffff430._M_current,
                          (char (*) [5])in_stack_fffffffffffff428._M_current);
        pvVar4 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[](&local_1e8,(long)local_1ec);
        std::vector<int,_std::allocator<int>_>::operator[](pvVar4,(long)local_37c);
        Print::operator<<((Print *)in_stack_fffffffffffff430._M_current,
                          in_stack_fffffffffffff428._M_current);
        Print::operator<<((Print *)in_stack_fffffffffffff430._M_current,
                          (_func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
                           *)in_stack_fffffffffffff428._M_current);
        Print::~Print(in_stack_fffffffffffff4a0);
      }
    }
  }
  std::vector<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>::vector
            ((vector<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_> *)0xf558c1);
  std::vector<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>::reserve
            ((vector<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_> *)
             in_stack_fffffffffffff460,(size_type)in_stack_fffffffffffff458);
  for (local_524 = 0; local_524 < local_1cc; local_524 = local_524 + 1) {
    local_530 = 0;
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::operator[](&local_1e8,(long)local_524);
    local_540 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                 (in_stack_fffffffffffff428._M_current);
    __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
    __normal_iterator<int*>
              ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
               in_stack_fffffffffffff430._M_current,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
               in_stack_fffffffffffff428._M_current);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::operator[](&local_1e8,(long)local_524);
    local_550 = (int *)std::vector<int,_std::allocator<int>_>::end
                                 (in_stack_fffffffffffff428._M_current);
    __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
    __normal_iterator<int*>
              ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
               in_stack_fffffffffffff430._M_current,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
               in_stack_fffffffffffff428._M_current);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                               *)in_stack_fffffffffffff430._M_current,
                              (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                               *)in_stack_fffffffffffff428._M_current), this_00 = local_10, bVar1) {
      piVar5 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&local_538);
      pvVar6 = std::vector<long,_std::allocator<long>_>::operator[](this_00,(long)*piVar5);
      local_530 = *pvVar6 + local_530;
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&local_538);
    }
    std::pair<long,_int>::pair<long_&,_int_&,_true>(&local_560,&local_530,&local_524);
    std::vector<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>::push_back
              ((vector<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_> *)
               in_stack_fffffffffffff430._M_current,
               (value_type *)in_stack_fffffffffffff428._M_current);
  }
  if ((local_29 & 1) != 0) {
    Sort((vector<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_> *)
         in_stack_fffffffffffff460,SUB81((ulong)in_stack_fffffffffffff458 >> 0x38,0));
  }
  iVar2 = (int)((ulong)in_stack_fffffffffffff438 >> 0x20);
  if (::(anonymous_namespace)::flag_verbose_mapper != 0) {
    local_568 = local_520;
    local_570._M_current =
         (pair<long,_int> *)
         std::vector<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>::begin
                   ((vector<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_> *)
                    in_stack_fffffffffffff428._M_current);
    local_578 = (pair<long,_int> *)
                std::vector<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>::end
                          ((vector<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_> *)
                           in_stack_fffffffffffff428._M_current);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<std::pair<long,_int>_*,_std::vector<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>_>
                          *)in_stack_fffffffffffff430._M_current,
                         (__normal_iterator<std::pair<long,_int>_*,_std::vector<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>_>
                          *)in_stack_fffffffffffff428._M_current);
      iVar2 = (int)((ulong)in_stack_fffffffffffff438 >> 0x20);
      if (!bVar1) break;
      local_580 = __gnu_cxx::
                  __normal_iterator<std::pair<long,_int>_*,_std::vector<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>_>
                  ::operator*(&local_570);
      OutStream();
      Print::Print(in_stack_fffffffffffff460,(ostream *)in_stack_fffffffffffff458);
      Print::operator<<((Print *)in_stack_fffffffffffff430._M_current,
                        (char (*) [10])in_stack_fffffffffffff428._M_current);
      in_stack_fffffffffffff4a0 =
           Print::operator<<((Print *)in_stack_fffffffffffff430._M_current,
                             in_stack_fffffffffffff428._M_current);
      Print::operator<<((Print *)in_stack_fffffffffffff430._M_current,
                        (char (*) [16])in_stack_fffffffffffff428._M_current);
      Print::operator<<((Print *)in_stack_fffffffffffff430._M_current,
                        (long *)in_stack_fffffffffffff428._M_current);
      Print::operator<<((Print *)in_stack_fffffffffffff430._M_current,
                        (_func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
                         *)in_stack_fffffffffffff428._M_current);
      Print::~Print(in_stack_fffffffffffff4a0);
      __gnu_cxx::
      __normal_iterator<std::pair<long,_int>_*,_std::vector<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>_>
      ::operator++(&local_570);
    }
  }
  Vector<int,_std::allocator<int>_>::Vector((Vector<int,_std::allocator<int>_> *)0xf55bde);
  Vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
  ::Vector((Vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
            *)0xf55beb);
  if (local_1cc == local_1c8) {
    if ((local_29 & 1) == 0) {
      std::vector<int,_std::allocator<int>_>::resize
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_fffffffffffff454,in_stack_fffffffffffff450),
                 in_stack_fffffffffffff448);
      local_740 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                   (in_stack_fffffffffffff428._M_current);
      local_748 = (int *)std::vector<int,_std::allocator<int>_>::end
                                   (in_stack_fffffffffffff428._M_current);
      std::iota<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
                (in_stack_fffffffffffff430,in_stack_fffffffffffff428,0);
    }
    else {
      LeastUsedCPUs((DistributionMapping *)in_stack_fffffffffffff440,iVar2,
                    (Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff430._M_current);
    }
  }
  else if ((local_29 & 1) == 0) {
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffff454,in_stack_fffffffffffff450),
               in_stack_fffffffffffff448);
    local_750 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                 (in_stack_fffffffffffff428._M_current);
    local_758 = (int *)std::vector<int,_std::allocator<int>_>::end
                                 (in_stack_fffffffffffff428._M_current);
    std::iota<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
              (in_stack_fffffffffffff430,in_stack_fffffffffffff428,0);
    std::
    vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
    ::resize((vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
              *)CONCAT44(in_stack_fffffffffffff454,in_stack_fffffffffffff450),
             in_stack_fffffffffffff448);
    local_760 = local_738;
    local_768._M_current =
         (Vector<int,_std::allocator<int>_> *)
         std::
         vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
         ::begin((vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
                  *)in_stack_fffffffffffff428._M_current);
    std::
    vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
    ::end((vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
           *)in_stack_fffffffffffff428._M_current);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<amrex::Vector<int,_std::allocator<int>_>_*,_std::vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>_>
                               *)in_stack_fffffffffffff430._M_current,
                              (__normal_iterator<amrex::Vector<int,_std::allocator<int>_>_*,_std::vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>_>
                               *)in_stack_fffffffffffff428._M_current), bVar1) {
      __gnu_cxx::
      __normal_iterator<amrex::Vector<int,_std::allocator<int>_>_*,_std::vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>_>
      ::operator*(&local_768);
      std::vector<int,_std::allocator<int>_>::resize
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_fffffffffffff454,in_stack_fffffffffffff450),
                 in_stack_fffffffffffff448);
      std::vector<int,_std::allocator<int>_>::begin
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff428._M_current);
      std::vector<int,_std::allocator<int>_>::end
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff428._M_current);
      std::iota<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
                (in_stack_fffffffffffff430,in_stack_fffffffffffff428,0);
      __gnu_cxx::
      __normal_iterator<amrex::Vector<int,_std::allocator<int>_>_*,_std::vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>_>
      ::operator++(&local_768);
    }
  }
  else {
    LeastUsedTeams(in_stack_fffffffffffff480,in_stack_fffffffffffff478,in_stack_fffffffffffff470,
                   (int)((ulong)in_stack_fffffffffffff468 >> 0x20),(int)in_stack_fffffffffffff468);
  }
  for (local_78c = 0; local_78c < local_1cc; local_78c = local_78c + 1) {
    pvVar7 = std::vector<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>::operator[]
                       (local_520,(long)local_78c);
    iVar2 = pvVar7->second;
    Vector<int,_std::allocator<int>_>::operator[]
              ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff430._M_current,
               (size_type)in_stack_fffffffffffff428._M_current);
    pvVar4 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[](&local_1e8,(long)iVar2);
    sVar3 = std::vector<int,_std::allocator<int>_>::size(pvVar4);
    if (::(anonymous_namespace)::flag_verbose_mapper != 0) {
      OutStream();
      Print::Print(in_stack_fffffffffffff460,(ostream *)in_stack_fffffffffffff458);
      Print::operator<<((Print *)in_stack_fffffffffffff430._M_current,
                        (char (*) [18])in_stack_fffffffffffff428._M_current);
      Print::operator<<((Print *)in_stack_fffffffffffff430._M_current,
                        in_stack_fffffffffffff428._M_current);
      in_stack_fffffffffffff460 =
           Print::operator<<((Print *)in_stack_fffffffffffff430._M_current,
                             (char (*) [10])in_stack_fffffffffffff428._M_current);
      in_stack_fffffffffffff458 =
           Print::operator<<((Print *)in_stack_fffffffffffff430._M_current,
                             in_stack_fffffffffffff428._M_current);
      Print::operator<<((Print *)in_stack_fffffffffffff430._M_current,
                        (_func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
                         *)in_stack_fffffffffffff428._M_current);
      Print::~Print(in_stack_fffffffffffff4a0);
    }
    if (local_1cc == local_1c8) {
      for (local_934 = 0; local_934 < (int)sVar3; local_934 = local_934 + 1) {
        iVar2 = ParallelContext::local_to_global_rank(0);
        std::
        __shared_ptr_access<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0xf55fe3);
        std::vector<int,_std::allocator<int>_>::operator[](pvVar4,(long)local_934);
        piVar8 = Vector<int,_std::allocator<int>_>::operator[]
                           (in_stack_fffffffffffff430._M_current,
                            in_stack_fffffffffffff428._M_current);
        *piVar8 = iVar2;
      }
    }
  }
  if (verbose != 0) {
    in_stack_fffffffffffff440 = OutStream();
    Print::Print(in_stack_fffffffffffff460,(ostream *)in_stack_fffffffffffff458);
    Print::operator<<((Print *)in_stack_fffffffffffff430._M_current,
                      (char (*) [22])in_stack_fffffffffffff428._M_current);
    this_01 = Print::operator<<((Print *)in_stack_fffffffffffff430._M_current,
                                (double *)in_stack_fffffffffffff428._M_current);
    Print::operator<<(this_01,(char *)in_stack_fffffffffffff428._M_current);
    Print::~Print(in_stack_fffffffffffff4a0);
  }
  Vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
  ::~Vector((Vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
             *)0xf560fb);
  Vector<int,_std::allocator<int>_>::~Vector((Vector<int,_std::allocator<int>_> *)0xf56108);
  std::vector<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>::~vector
            ((vector<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_> *)
             in_stack_fffffffffffff440);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)in_stack_fffffffffffff440);
  return;
}

Assistant:

void
DistributionMapping::KnapSackDoIt (const std::vector<Long>& wgts,
                                   int                    /*  nprocs */,
                                   Real&                    efficiency,
                                   bool                     do_full_knapsack,
                                   int                      nmax,
                                   bool                     sort)
{
    if (flag_verbose_mapper) {
        Print() << "DM: KnapSackDoIt called..." << std::endl;
    }

    BL_PROFILE("DistributionMapping::KnapSackDoIt()");

    int nprocs = ParallelContext::NProcsSub();

    // If team is not use, we are going to treat it as a special case in which
    // the number of teams is nprocs and the number of workers is 1.

    int nteams = nprocs;
    int nworkers = 1;
#if defined(BL_USE_TEAM)
    nteams = ParallelDescriptor::NTeams();
    nworkers = ParallelDescriptor::TeamSize();
#endif

    std::vector< std::vector<int> > vec;

    efficiency = 0;

    knapsack(wgts,nteams,vec,efficiency,do_full_knapsack,nmax);

    if (flag_verbose_mapper) {
        for (int i = 0, ni = vec.size(); i < ni; ++i) {
            Print() << "  Bucket " << i << " contains boxes:" << std::endl;
            for (int j = 0, nj = vec[i].size(); j < nj; ++j) {
                Print() << "    " << vec[i][j] << std::endl;
            }
        }
    }

    BL_ASSERT(static_cast<int>(vec.size()) == nteams);

    std::vector<LIpair> LIpairV;

    LIpairV.reserve(nteams);

    for (int i = 0; i < nteams; ++i)
    {
        Long wgt = 0;
        for (std::vector<int>::const_iterator lit = vec[i].begin(), End = vec[i].end();
             lit != End; ++lit)
        {
            wgt += wgts[*lit];
        }

        LIpairV.push_back(LIpair(wgt,i));
    }

    if (sort) {Sort(LIpairV, true);}

    if (flag_verbose_mapper) {
        for (const auto &p : LIpairV) {
            Print() << "  Bucket " << p.second << " total weight: " << p.first << std::endl;
        }
    }

    Vector<int> ord;
    Vector<Vector<int> > wrkerord;

    if (nteams == nprocs) {
        if (sort) {
            LeastUsedCPUs(nprocs,ord);
        } else {
            ord.resize(nprocs);
            std::iota(ord.begin(), ord.end(), 0);
        }
    } else {
        if (sort) {
            LeastUsedTeams(ord,wrkerord,nteams,nworkers);
        } else {
            ord.resize(nteams);
            std::iota(ord.begin(), ord.end(), 0);
            wrkerord.resize(nteams);
            for (auto& v : wrkerord) {
                v.resize(nworkers);
                std::iota(v.begin(), v.end(), 0);
            }
        }
    }

    for (int i = 0; i < nteams; ++i)
    {
        const int idx = LIpairV[i].second;
        const int tid = ord[i];

        const std::vector<int>& vi = vec[idx];
        const int N = vi.size();

        if (flag_verbose_mapper) {
            Print() << "  Mapping bucket " << idx << " to rank " << tid << std::endl;
        }

        if (nteams == nprocs) {
            for (int j = 0; j < N; ++j)
            {
                m_ref->m_pmap[vi[j]] = ParallelContext::local_to_global_rank(tid);
            }
        } else {
#ifdef BL_USE_TEAM
            int leadrank = tid * nworkers;
            for (int w = 0; w < nworkers; ++w)
            {
                ParallelDescriptor::team_for(0, N, w, [&] (int j) {
                        m_ref->m_pmap[vi[j]] = leadrank + wrkerord[i][w];
                    });
            }
#endif
        }
    }

    if (verbose)
    {
        amrex::Print() << "KNAPSACK efficiency: " << efficiency << '\n';
    }

}